

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.cpp
# Opt level: O2

void __thiscall
Assimp::MD5::MD5CameraParser::MD5CameraParser(MD5CameraParser *this,SectionList *mSections)

{
  string *__lhs;
  char *pcVar1;
  char cVar2;
  pointer pEVar3;
  pointer pCVar4;
  bool bVar5;
  uint uVar6;
  Logger *pLVar7;
  Element *elem;
  pointer pEVar8;
  pointer pSVar9;
  Element *elem_1;
  ai_real aVar10;
  char *sz;
  MD5CameraParser *local_80;
  CameraFrameList *local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_70;
  pointer local_68;
  pointer local_60;
  CameraAnimFrameDesc local_58;
  
  local_70 = &this->cuts;
  local_78 = &this->frames;
  (this->frames).
  super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->frames).
  super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cuts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->frames).
  super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cuts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cuts).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80 = this;
  pLVar7 = DefaultLogger::get();
  Logger::debug(pLVar7,"MD5CameraParser begin");
  local_80->fFrameRate = 24.0;
  local_60 = (mSections->
             super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  for (pSVar9 = (mSections->
                super__Vector_base<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>).
                _M_impl.super__Vector_impl_data._M_start; pSVar9 != local_60; pSVar9 = pSVar9 + 1) {
    __lhs = &pSVar9->mName;
    bVar5 = std::operator==(__lhs,"numFrames");
    if (bVar5) {
      uVar6 = strtoul10((pSVar9->mGlobalValue)._M_dataplus._M_p,(char **)0x0);
      std::
      vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>::
      reserve(local_78,(ulong)uVar6);
    }
    else {
      bVar5 = std::operator==(__lhs,"frameRate");
      if (bVar5) {
        aVar10 = fast_atof((pSVar9->mGlobalValue)._M_dataplus._M_p);
        local_80->fFrameRate = aVar10;
      }
      else {
        bVar5 = std::operator==(__lhs,"numCuts");
        if (bVar5) {
          uVar6 = strtoul10((pSVar9->mGlobalValue)._M_dataplus._M_p,(char **)0x0);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(local_70,(ulong)uVar6);
        }
        else {
          bVar5 = std::operator==(__lhs,"cuts");
          if (bVar5) {
            pEVar3 = (pSVar9->mElements).
                     super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pEVar8 = (pSVar9->mElements).
                          super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                          ._M_impl.super__Vector_impl_data._M_start; pEVar8 != pEVar3;
                pEVar8 = pEVar8 + 1) {
              uVar6 = strtoul10(pEVar8->szStart,(char **)0x0);
              local_58.super_BaseFrameDesc.vPositionXYZ.x = (float)(uVar6 + 1);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                        (local_70,(uint *)&local_58);
            }
          }
          else {
            bVar5 = std::operator==(__lhs,"camera");
            if (bVar5) {
              local_68 = (pSVar9->mElements).
                         super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              for (pEVar8 = (pSVar9->mElements).
                            super__Vector_base<Assimp::MD5::Element,_std::allocator<Assimp::MD5::Element>_>
                            ._M_impl.super__Vector_impl_data._M_start; pEVar8 != local_68;
                  pEVar8 = pEVar8 + 1) {
                sz = pEVar8->szStart;
                local_58.super_BaseFrameDesc.vRotationQuat.y = 0.0;
                local_58.super_BaseFrameDesc.vRotationQuat.z = 0.0;
                local_58.fFOV = 0.0;
                local_58.super_BaseFrameDesc.vPositionXYZ.x = 0.0;
                local_58.super_BaseFrameDesc.vPositionXYZ.y = 0.0;
                local_58.super_BaseFrameDesc.vPositionXYZ.z = 0.0;
                local_58.super_BaseFrameDesc.vRotationQuat.x = 0.0;
                std::
                vector<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                ::emplace_back<Assimp::MD5::CameraAnimFrameDesc>(local_78,&local_58);
                pCVar4 = (local_80->frames).
                         super__Vector_base<Assimp::MD5::CameraAnimFrameDesc,_std::allocator<Assimp::MD5::CameraAnimFrameDesc>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                bVar5 = SkipSpaces<char>(&sz);
                if (!bVar5) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar8->iLineNumber);
                }
                pcVar1 = sz + 1;
                cVar2 = *sz;
                sz = pcVar1;
                if (cVar2 != '(') {
                  MD5Parser::ReportWarning("Unexpected token: ( was expected",pEVar8->iLineNumber);
                }
                bVar5 = SkipSpaces<char>(&sz);
                if (!bVar5) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar8->iLineNumber);
                }
                sz = fast_atoreal_move<float>(sz,(float *)(pCVar4 + -1),true);
                bVar5 = SkipSpaces<char>(&sz);
                if (!bVar5) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar8->iLineNumber);
                }
                sz = fast_atoreal_move<float>
                               (sz,&pCVar4[-1].super_BaseFrameDesc.vPositionXYZ.y,true);
                bVar5 = SkipSpaces<char>(&sz);
                if (!bVar5) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar8->iLineNumber);
                }
                sz = fast_atoreal_move<float>
                               (sz,&pCVar4[-1].super_BaseFrameDesc.vPositionXYZ.z,true);
                bVar5 = SkipSpaces<char>(&sz);
                if (!bVar5) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar8->iLineNumber);
                }
                pcVar1 = sz + 1;
                cVar2 = *sz;
                sz = pcVar1;
                if (cVar2 != ')') {
                  MD5Parser::ReportWarning("Unexpected token: ) was expected",pEVar8->iLineNumber);
                }
                bVar5 = SkipSpaces<char>(&sz);
                if (!bVar5) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar8->iLineNumber);
                }
                pcVar1 = sz + 1;
                cVar2 = *sz;
                sz = pcVar1;
                if (cVar2 != '(') {
                  MD5Parser::ReportWarning("Unexpected token: ( was expected",pEVar8->iLineNumber);
                }
                bVar5 = SkipSpaces<char>(&sz);
                if (!bVar5) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar8->iLineNumber);
                }
                sz = fast_atoreal_move<float>
                               (sz,&pCVar4[-1].super_BaseFrameDesc.vRotationQuat.x,true);
                bVar5 = SkipSpaces<char>(&sz);
                if (!bVar5) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar8->iLineNumber);
                }
                sz = fast_atoreal_move<float>
                               (sz,&pCVar4[-1].super_BaseFrameDesc.vRotationQuat.y,true);
                bVar5 = SkipSpaces<char>(&sz);
                if (!bVar5) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar8->iLineNumber);
                }
                sz = fast_atoreal_move<float>
                               (sz,&pCVar4[-1].super_BaseFrameDesc.vRotationQuat.z,true);
                bVar5 = SkipSpaces<char>(&sz);
                if (!bVar5) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar8->iLineNumber);
                }
                pcVar1 = sz + 1;
                cVar2 = *sz;
                sz = pcVar1;
                if (cVar2 != ')') {
                  MD5Parser::ReportWarning("Unexpected token: ) was expected",pEVar8->iLineNumber);
                }
                bVar5 = SkipSpaces<char>(&sz);
                if (!bVar5) {
                  MD5Parser::ReportWarning("Unexpected end of line",pEVar8->iLineNumber);
                }
                aVar10 = fast_atof(sz);
                pCVar4[-1].fFOV = aVar10;
              }
            }
          }
        }
      }
    }
  }
  pLVar7 = DefaultLogger::get();
  Logger::debug(pLVar7,"MD5CameraParser end");
  return;
}

Assistant:

MD5CameraParser::MD5CameraParser(SectionList& mSections)
{
    ASSIMP_LOG_DEBUG("MD5CameraParser begin");
    fFrameRate = 24.0f;

    for (SectionList::const_iterator iter =  mSections.begin(), iterEnd = mSections.end();iter != iterEnd;++iter) {
        if ((*iter).mName == "numFrames")   {
            frames.reserve(strtoul10((*iter).mGlobalValue.c_str()));
        }
        else if ((*iter).mName == "frameRate")  {
            fFrameRate = fast_atof ((*iter).mGlobalValue.c_str());
        }
        else if ((*iter).mName == "numCuts")    {
            cuts.reserve(strtoul10((*iter).mGlobalValue.c_str()));
        }
        else if ((*iter).mName == "cuts")   {
            for (const auto & elem : (*iter).mElements){
                cuts.push_back(strtoul10(elem.szStart)+1);
            }
        }
        else if ((*iter).mName == "camera") {
            for (const auto & elem : (*iter).mElements){
                const char* sz = elem.szStart;

                frames.push_back(CameraAnimFrameDesc());
                CameraAnimFrameDesc& cur = frames.back();
                AI_MD5_READ_TRIPLE(cur.vPositionXYZ);
                AI_MD5_READ_TRIPLE(cur.vRotationQuat);
                AI_MD5_SKIP_SPACES();
                cur.fFOV = fast_atof(sz);
            }
        }
    }
    ASSIMP_LOG_DEBUG("MD5CameraParser end");
}